

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O3

_Bool prof_dump_printf(_Bool propagate_err,char *format,...)

{
  prof_tdata_t *ppVar1;
  char in_AL;
  prof_tdata_t *ppVar2;
  uint uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  prof_tdata_t *node;
  prof_tdata_t *extraout_RDX;
  prof_tdata_t *arg;
  _func_prof_tdata_t_ptr_prof_tdata_tree_t_ptr_prof_tdata_t_ptr_void_ptr *cb_00;
  prof_tdata_tree_t *tdatas;
  prof_tdata_tree_t *rbtree;
  void *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [128];
  __va_list_tag local_158;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 local_120;
  void *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  prof_tdata_tree_t local_88 [17];
  _func_prof_tdata_t_ptr_prof_tdata_tree_t_ptr_prof_tdata_t_ptr_void_ptr *cb;
  
  local_158.reg_save_area = local_138;
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  local_158.gp_offset = 0x10;
  local_158.fp_offset = 0x30;
  local_158.overflow_arg_area = &ap[0].overflow_arg_area;
  rbtree = local_88;
  tdatas = (prof_tdata_tree_t *)0x80;
  local_128 = in_RDX;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  malloc_vsnprintf((char *)rbtree,0x80,format,&local_158);
  ppVar2 = rbtree[1].rbt_root;
  arg = node;
  while( true ) {
    ppVar1 = tdatas[1].rbt_root;
    uVar3 = (uint)(ppVar2 >= ppVar1 && ppVar2 != ppVar1) - (uint)(ppVar2 < ppVar1);
    if (uVar3 == 0) {
      arg = rbtree[2].rbt_root;
      ppVar1 = tdatas[2].rbt_root;
      uVar3 = (uint)(arg >= ppVar1 && arg != ppVar1) - (uint)(arg < ppVar1);
    }
    cb = (_func_prof_tdata_t_ptr_prof_tdata_tree_t_ptr_prof_tdata_t_ptr_void_ptr *)(ulong)uVar3;
    if ((int)uVar3 < 0) break;
    if (uVar3 == 0) goto LAB_0013ba0b;
    tdatas = (prof_tdata_tree_t *)((ulong)tdatas[6].rbt_root & 0xfffffffffffffffe);
  }
  ppVar2 = tdata_tree_iter_start(rbtree,tdatas[5].rbt_root,node,cb,in_R8);
  arg = extraout_RDX;
  if (ppVar2 != (prof_tdata_t *)0x0) goto LAB_0013ba1b;
LAB_0013ba0b:
  ppVar2 = prof_tdata_reset_iter(tdatas,node,arg);
  if (ppVar2 == (prof_tdata_t *)0x0) {
    ppVar2 = tdata_tree_iter_recurse
                       ((prof_tdata_tree_t *)((ulong)tdatas[6].rbt_root & 0xfffffffffffffffe),node,
                        cb_00,cb);
    return SUB81(ppVar2,0);
  }
LAB_0013ba1b:
  return SUB81(ppVar2,0);
}

Assistant:

static bool
prof_dump_printf(bool propagate_err, const char *format, ...) {
	bool ret;
	va_list ap;
	char buf[PROF_PRINTF_BUFSIZE];

	va_start(ap, format);
	malloc_vsnprintf(buf, sizeof(buf), format, ap);
	va_end(ap);
	ret = prof_dump_write(propagate_err, buf);

	return ret;
}